

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<float>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  string *psVar1;
  _Rb_tree_node_base *__k;
  __type _Var2;
  bool bVar3;
  int iVar4;
  value_type *value;
  ostream *poVar5;
  size_type sVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  UsdPrimvarReader_float *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  allocator local_5c9;
  UsdPrimvarReader_float *local_5c8;
  string *local_5c0;
  _Rb_tree_node_base *local_5b8;
  ParseResult ret;
  string local_580;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_560;
  UsdPrimvarReader_float *local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  optional<tinyusdz::Animatable<float>> *local_530;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_528;
  string *local_520;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_518;
  TypedTerminalAttribute<float> *local_510;
  _Rb_tree_node_base *local_508;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string local_488;
  string local_468 [32];
  string local_448;
  ostringstream ss_e_1;
  undefined1 local_420 [368];
  optional<tinyusdz::Animatable<float>_> av;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = preader;
  local_5c0 = err;
  local_520 = warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_508 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_518 = &(preader->fallback)._paths;
  local_530 = (optional<tinyusdz::Animatable<float>> *)&(preader->fallback)._attrib;
  local_560 = &preader->varname;
  local_510 = &preader->result;
  local_528 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
  local_558 = preader;
  while( true ) {
    if (p_Var7 == local_508) break;
    local_5b8 = p_Var7 + 1;
    ::std::__cxx11::string::string((string *)&local_4a8,(string *)local_5b8);
    local_5c8 = (UsdPrimvarReader_float *)(p_Var7 + 2);
    ::std::__cxx11::string::string((string *)&local_580,"inputs:fallback",(allocator *)&local_550);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar4 = ::std::__cxx11::string::compare((string *)&local_4a8);
    if (iVar4 == 0) {
      if (((ulong)p_Var7[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",
                   (allocator *)&attr_type_name);
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,&local_580,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if (p_Var7[6]._M_left != p_Var7[6]._M_parent) {
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_518,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var7[6]._M_parent);
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)local_5c8);
      tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,&attr_type_name);
      if (_Var2) {
        ::std::__cxx11::string::_M_dispose();
LAB_001d2e31:
        iVar4 = *(int *)((long)&p_Var7[0x17]._M_parent + 4);
        if (iVar4 == 1) {
          bVar3 = Attribute::is_blocked((Attribute *)local_5c8);
          if (bVar3) {
            (local_558->fallback)._blocked = true;
          }
          bVar3 = primvar::PrimVar::has_value((PrimVar *)&p_Var7[4]._M_parent);
          if ((bVar3) || (p_Var7[5]._M_left != p_Var7[5]._M_parent)) {
            anon_unknown_0::ConvertToAnimatable<float>
                      ((optional<tinyusdz::Animatable<float>_> *)&ss_e_1,
                       (PrimVar *)&p_Var7[4]._M_parent);
            nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::
            optional<tinyusdz::Animatable<float>,_0>
                      (&av,(optional<tinyusdz::Animatable<float>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::~optional
                      ((optional<tinyusdz::Animatable<float>_> *)&ss_e_1);
            bVar3 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                        (local_530,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::~optional(&av);
            if (bVar3 != false) goto LAB_001d2fe6;
          }
          else if (p_Var7[6]._M_left != p_Var7[6]._M_parent) {
            AttrMetas::operator=(&(preader->fallback)._metas,(AttrMetas *)(p_Var7 + 7));
            __v = &local_4a8;
            goto LAB_001d3002;
          }
        }
        else if (iVar4 == 0) {
          (local_558->fallback)._value_empty = true;
LAB_001d2fe6:
          __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_580;
          AttrMetas::operator=(&(preader->fallback)._metas,(AttrMetas *)(p_Var7 + 7));
LAB_001d3002:
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,__v);
          ret.code = Success;
        }
        else {
          ::std::__cxx11::string::assign((char *)&ret.err);
          ret.code = InternalError;
        }
      }
      else {
        tinyusdz::value::TypeTraits<float>::underlying_type_name_abi_cxx11_();
        _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var2) goto LAB_001d2e31;
        ret.code = TypeMismatch;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar5 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ");
        poVar5 = ::std::operator<<(poVar5,(string *)&local_580);
        poVar5 = ::std::operator<<(poVar5," expects type `");
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        poVar5 = ::std::operator<<(poVar5,(string *)&ss_e_1);
        poVar5 = ::std::operator<<(poVar5,"` but defined as type `");
        poVar5 = ::std::operator<<(poVar5,(string *)&attr_type_name);
        ::std::operator<<(poVar5,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar4 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      iVar4 = 3;
LAB_001d3178:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar5 = ::std::operator<<((ostream *)&av,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1049);
        ::std::operator<<(poVar5," ");
        ::std::__cxx11::string::string
                  ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&local_580);
        args = (UsdPrimvarReader_float *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&attr_type_name,(string *)"inputs:fallback",
                   (char (*) [16])args,warn);
        poVar5 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar1 = local_5c0;
        if (local_5c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,&attr_type_name,psVar1);
          ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        iVar4 = 1;
        goto LAB_001d3178;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar3) {
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5b8,"inputs:varname");
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&av,"inputs:varname",(allocator *)&ss_e_1);
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&av);
        ::std::__cxx11::string::_M_dispose();
        if (sVar6 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::string((string *)&local_448,(string *)local_5b8);
          ::std::__cxx11::string::string
                    ((string *)&ss_e_1,"inputs:varname",(allocator *)&attr_type_name);
          args = local_5c8;
          warn = (string *)&ss_e_1;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret,&table,&local_448,(Property *)local_5c8,(string *)&ss_e_1,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret.code == TypeMismatch) {
            ::std::__cxx11::string::string(local_468,(string *)local_5b8);
            ::std::__cxx11::string::string
                      ((string *)&ss_e_1,"inputs:varname",(allocator *)&local_580);
            args = local_5c8;
            warn = (string *)&ss_e_1;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)&attr_type_name,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_468,(string *)local_5c8,(Property *)&ss_e_1,(string *)local_560,
                       in_stack_fffffffffffffa28);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar4 = 3;
            if ((int)attr_type_name._M_dataplus._M_p != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar5 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1062);
              ::std::operator<<(poVar5," ");
              ::std::__cxx11::string::string
                        ((string *)&local_550,"Faied to parse inputs:varname: {}",&local_5c9);
              fmt::format<std::__cxx11::string>
                        (&local_580,(fmt *)&local_550,(string *)&attr_type_name._M_string_length,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar5 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_580);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar1 = local_5c0;
              if (local_5c0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_580,&local_550,psVar1);
                ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_580);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar4 = 1;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar4 = 0;
            if (ret.code == Success) {
              bVar3 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av,
                                 local_560);
              iVar4 = 3;
              if (!bVar3) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
                poVar5 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1050);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)&ss_e_1,
                                           "Failed to convert inputs:varname token type to string type."
                                          );
                ::std::operator<<(poVar5,"\n");
                psVar1 = local_5c0;
                if (local_5c0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+(&attr_type_name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_580,psVar1);
                  ::std::__cxx11::string::operator=((string *)psVar1,(string *)&attr_type_name);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
                iVar4 = 1;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          if (iVar4 != 0) goto LAB_001d3859;
        }
      }
      ::std::__cxx11::string::string((string *)&local_488,(string *)local_5b8);
      ::std::__cxx11::string::string((string *)&av,"outputs:result",(allocator *)&ret);
      args = local_5c8;
      warn = (string *)&av;
      anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                ((ParseResult *)&ss_e_1,&table,&local_488,(Property *)local_5c8,(string *)&av,
                 local_510);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((_ss_e_1 & 0xfffffffd) == 0) {
        iVar4 = 3;
LAB_001d3383:
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (_ss_e_1 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar5 = ::std::operator<<((ostream *)&av,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1068);
          ::std::operator<<(poVar5," ");
          ::std::__cxx11::string::string
                    ((string *)&attr_type_name,
                     "Parsing shader output property `{}` failed. Error: {}",(allocator *)&local_580
                    );
          args = (UsdPrimvarReader_float *)local_420;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&attr_type_name,(string *)0x48c502,(char (*) [15])args,
                     warn);
          poVar5 = ::std::operator<<((ostream *)&av,(string *)&ret);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c0;
          if (local_5c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,&attr_type_name,psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar4 = 1;
          goto LAB_001d3383;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      __k = local_5b8;
      if (!bVar3) goto LAB_001d3859;
      sVar6 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)local_5b8);
      if (sVar6 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](local_528,(key_type *)__k);
        Property::operator=(this,(Property *)local_5c8);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
      }
      sVar6 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__k);
      if (sVar6 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar5 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x106a);
        ::std::operator<<(poVar5," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        poVar5 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::_M_dispose();
        psVar1 = local_520;
        if (local_520 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,local_5c0);
          ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001d3859:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
    p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return false;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return false;
}